

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O2

void __thiscall chrono::ChAssembly::FlushBatch(ChAssembly *this)

{
  __shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  p_Var1 = &((this->batch_to_insert).
             super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var2 = &((this->batch_to_insert).
                  super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>;
      p_Var2 != p_Var1; p_Var2 = p_Var2 + 1) {
    std::__shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,p_Var2);
    Add(this,(shared_ptr<chrono::ChPhysicsItem> *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  std::
  vector<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
  ::clear(&this->batch_to_insert);
  return;
}

Assistant:

void ChAssembly::FlushBatch() {
    for (auto& item : batch_to_insert) {
        Add(item);
    }
    batch_to_insert.clear();
}